

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 soft_f64_muladd(float64 a,float64 b,float64 c,int flags,float_status *status)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  uint uVar7;
  int count;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  FloatParts FVar21;
  FloatParts FVar22;
  FloatParts FVar23;
  FloatParts p;
  FloatParts b_00;
  uint64_t c_lo;
  uint64_t c_hi;
  float_status *in_stack_ffffffffffffff80;
  uint local_78;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  uint64_t local_48;
  ulong local_40;
  uint64_t local_38;
  
  local_50 = CONCAT44(in_register_0000000c,flags);
  FVar21._8_8_ = a >> 0x34 & 0x7ff | a >> 0x17 & 0x10000000000;
  FVar21.frac = a & 0xfffffffffffff;
  FVar21 = sf_canonicalize(FVar21,&float64_params,status);
  uVar20 = FVar21._8_8_;
  uVar12 = FVar21.frac;
  FVar22.frac = b & 0xfffffffffffff;
  FVar22._8_8_ = b >> 0x34 & 0x7ff | b >> 0x17 & 0x10000000000;
  FVar22 = sf_canonicalize(FVar22,&float64_params,status);
  uVar10 = FVar22.frac;
  FVar23.frac = c & 0xfffffffffffff;
  FVar23._8_8_ = c >> 0x34 & 0x7ff | c >> 0x17 & 0x10000000000;
  FVar23 = sf_canonicalize(FVar23,&float64_params,status);
  uVar18 = FVar23.frac;
  if (((((undefined1  [16])FVar21 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0) ||
      (((undefined1  [16])FVar22 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) ||
     (((undefined1  [16])FVar23 & (undefined1  [16])0xfc00000000) != (undefined1  [16])0x0)) {
    uVar20 = FVar22._8_8_ & 0xffffffffffff;
    b_00.exp = (int)uVar20;
    b_00.cls = (char)(uVar20 >> 0x20);
    b_00.sign = (_Bool)(char)(uVar20 >> 0x28);
    b_00._14_2_ = (short)(uVar20 >> 0x30);
    b_00.frac = uVar10;
    p = pick_nan_muladd(FVar21,b_00,FVar23,SUB81(status,0),in_stack_ffffffffffffff80);
    goto LAB_00cf0f13;
  }
  uVar6 = FVar22._12_4_ & 0xff;
  uVar7 = FVar21._12_4_ & 0xff;
  if ((1 << (FVar22.cls & 0x1f) | 1 << (FVar21._12_4_ & 0x1f)) == 10) {
LAB_00cf0dda:
    p.exp = 0x7fffffff;
    p.cls = float_class_qnan;
    p.sign = false;
    p._14_2_ = 0;
    p.frac = 0x2000000000000000;
    status->float_exception_flags = status->float_exception_flags | 1;
    goto LAB_00cf0f13;
  }
  uVar14 = (uint)local_50;
  uVar15 = uVar14 & 4;
  uVar19 = 0x10000000000;
  uVar17 = FVar23._8_8_ & 0xffff0103ffffffff ^ 0x10000000000;
  if ((local_50 & 1) == 0) {
    uVar17 = FVar23._8_8_;
  }
  uVar4 = (FVar22._8_8_ ^ uVar20) & 0x10000000000;
  uVar8 = (ulong)(uVar4 == 0);
  if ((local_50 & 2) == 0) {
    uVar8 = uVar4 >> 0x28;
  }
  local_78 = (uint)uVar8;
  uVar2 = (uint)(uVar17 >> 0x20);
  if ((uVar7 == 3) || (uVar6 == 3)) {
    if ((~uVar17 & 0x300000000) == 0) {
      uVar6 = uVar2 >> 8 & 1;
      if (uVar6 == local_78) goto LAB_00cf0ebf;
      goto LAB_00cf0dda;
    }
    if (uVar15 >> 2 == local_78) {
      uVar19 = 0;
    }
    uVar19 = uVar19 | uVar20 & 0xffff0000ffffffff | 0x300000000;
LAB_00cf0f0e:
    p.exp = (int)uVar19;
    p.cls = (char)(uVar19 >> 0x20);
    p.sign = (_Bool)(char)(uVar19 >> 0x28);
    p._14_2_ = (short)(uVar19 >> 0x30);
    p.frac = uVar12;
    goto LAB_00cf0f13;
  }
  uVar3 = uVar2 & 3;
  if (uVar3 == 3) {
    uVar6 = uVar2 >> 8 & 1;
LAB_00cf0ebf:
    if (uVar6 == uVar15 >> 2) {
      uVar19 = 0;
    }
    uVar19 = uVar19 | uVar20 & 0xffff0000ffffffff | 0x300000000;
    goto LAB_00cf0f0e;
  }
  uVar16 = (uint)uVar17;
  if ((uVar7 == 1) || (uVar6 == 1)) {
    if (uVar3 == 1) {
      if ((uVar2 >> 8 & 1) != local_78) {
        uVar8 = (ulong)(status->float_rounding_mode == '\x01');
      }
      uVar17 = uVar17 & 0xffff0003ffffffff | uVar8 << 0x28;
    }
    else if ((local_50 & 8) != 0) {
      uVar17 = uVar17 & 0xffffff0300000000 | (ulong)(uVar16 - 1);
    }
    if (((uint)(uVar17 >> 0x28) & 1) == uVar15 >> 2) {
      uVar19 = 0;
    }
    uVar19 = uVar19 | uVar17 & 0xffff00ffffffffff;
    p.exp = (int)uVar19;
    p.cls = (char)(uVar19 >> 0x20);
    p.sign = (_Bool)(char)(uVar19 >> 0x28);
    p._14_2_ = (short)(uVar19 >> 0x30);
    p.frac = uVar18;
    goto LAB_00cf0f13;
  }
  if ((uVar7 != 2) || (uVar6 != 2)) {
    __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                  ,0x58e,
                  "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                 );
  }
  uVar13 = (uVar12 & 0xffffffff) * (uVar10 >> 0x20);
  uVar8 = (uVar10 & 0xffffffff) * (uVar12 >> 0x20);
  lVar11 = 0;
  uVar4 = uVar8 + uVar13;
  if (CARRY8(uVar8,uVar13)) {
    lVar11 = 0x100000000;
  }
  uVar8 = uVar10 * uVar12;
  uVar9 = (uVar4 >> 0x20) + (uVar10 >> 0x20) * (uVar12 >> 0x20) + lVar11 +
          (ulong)(uVar8 < uVar4 << 0x20);
  uVar6 = FVar22.exp + FVar21.exp;
  if ((uVar9 >> 0x3d & 1) != 0) {
    uVar8 = (ulong)((uint)uVar8 & 1) | uVar9 << 0x3f | uVar8 >> 1;
    uVar9 = uVar9 >> 1;
    uVar6 = uVar6 + 1;
  }
  local_60 = uVar8;
  local_38 = uVar9;
  if (uVar3 == 1) {
    uVar9 = (ulong)((uVar8 & 0x3fffffffffffffff) != 0) | uVar9 << 2 | uVar8 >> 0x3e;
  }
  else {
    count = uVar6 - uVar16;
    local_58 = uVar20;
    if ((uVar2 >> 8 & 1) == local_78) {
      if (count < 1) {
        shift128RightJamming(uVar9,uVar8,0x3e - count,&local_38,&local_60);
        uVar9 = uVar18 + local_60;
      }
      else {
        local_40 = uVar18 >> 2;
        local_48 = 0;
        shift128RightJamming(local_40,0,count,&local_40,&local_48);
        uVar9 = (ulong)((uVar8 + local_48 & 0x3fffffffffffffff) != 0) |
                (uVar9 + local_40 + (ulong)CARRY8(uVar8,local_48)) * 4 | uVar8 + local_48 >> 0x3e;
        uVar17 = (ulong)uVar6;
      }
      uVar6 = (uint)uVar17;
      uVar14 = (uint)local_50;
      uVar20 = local_58;
      if ((long)uVar9 < 0) {
        uVar9 = (ulong)((uint)uVar9 & 1) | uVar9 >> 1;
        uVar6 = uVar6 + 1;
      }
    }
    else {
      uVar18 = uVar18 >> 2;
      local_48 = 0;
      local_40 = uVar18;
      if (count < 1) {
        shift128RightJamming(uVar9,uVar8,-count,&local_38,&local_60);
        if ((uVar6 == uVar16) && (uVar10 = local_38 - uVar18, uVar20 = local_60, uVar18 <= local_38)
           ) goto LAB_00cf121a;
        uVar20 = -local_60;
        uVar10 = (uVar18 - local_38) - (ulong)(local_60 != 0);
        local_78 = local_78 ^ 1;
      }
      else {
        shift128RightJamming(uVar18,0,count,&local_40,&local_48);
        uVar10 = (uVar9 - local_40) - (ulong)(uVar8 < local_48);
        uVar20 = uVar8 - local_48;
LAB_00cf121a:
        uVar17 = (ulong)uVar6;
      }
      if (uVar10 == 0 && uVar20 == 0) {
        if (uVar15 >> 2 == (uint)(status->float_rounding_mode == '\x01')) {
          uVar19 = 0;
        }
        uVar19 = (uVar19 | local_58 & 0xffff0000ffffffff) + 0x100000000;
        goto LAB_00cf0f0e;
      }
      uVar14 = (uint)local_50;
      if (uVar10 == 0) {
        if (uVar20 == 0) {
          uVar12 = 0x40;
        }
        else {
          uVar12 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar12 = uVar12 ^ 0x3f;
        }
        if (uVar12 == 0) {
          uVar6 = 0x40;
          goto LAB_00cf1244;
        }
        uVar6 = (int)uVar12 + 0x40;
        uVar9 = uVar20 << ((char)uVar12 - 1U & 0x3f);
      }
      else {
        lVar11 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar6 = (uint)lVar11 ^ 0x3f;
LAB_00cf1244:
        bVar5 = (char)uVar6 - 1;
        bVar1 = bVar5 & 0x3f;
        uVar9 = (ulong)(uVar20 << (bVar5 & 0x3f) != 0) | uVar10 << bVar1 | uVar20 >> 0x40 - bVar1;
      }
      uVar6 = ((int)uVar17 - uVar6) + 3;
      uVar20 = local_58;
    }
  }
  if (uVar15 >> 2 == local_78) {
    uVar19 = 0;
  }
  uVar20 = uVar19 | uVar20 & 0xffff000000000000 | (ulong)(((int)(uVar14 << 0x1c) >> 0x1f) + uVar6) |
           0x200000000;
  p.exp = (int)uVar20;
  p.cls = (char)(uVar20 >> 0x20);
  p.sign = (_Bool)(char)(uVar20 >> 0x28);
  p._14_2_ = (short)(uVar20 >> 0x30);
  p.frac = uVar9;
LAB_00cf0f13:
  FVar21 = round_canonical(p,status,&float64_params);
  return FVar21.frac & 0xfffffffffffff | (ulong)(FVar21.exp & 0x7ff) << 0x34 |
         (FVar21._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_muladd(float64 a, float64 b, float64 c, int flags,
                float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pc = float64_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float64_round_pack_canonical(pr, status);
}